

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

ElementPtr __thiscall Rml::Element::RemoveChild(Element *this,Element *child)

{
  iterator iVar1;
  bool bVar2;
  pointer this_00;
  pointer pEVar3;
  size_type sVar4;
  reference puVar5;
  Context *this_01;
  pointer in_RDX;
  Element *local_78;
  Element *focus_element;
  Context *context;
  const_iterator local_50;
  undefined1 local_45;
  int local_44;
  pointer pEStack_40;
  int i;
  Element *ancestor;
  __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
  local_30;
  iterator itr;
  size_t child_index;
  Element *child_local;
  Element *this_local;
  ElementPtr *detached_child;
  
  itr._M_current = (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)0x0;
  local_30._M_current =
       (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
       ::std::
       vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
       ::begin(&child->children);
  while( true ) {
    ancestor = (Element *)
               ::std::
               vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
               ::end(&child->children);
    bVar2 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                        *)&ancestor);
    if (!bVar2) {
      ::std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>::
      unique_ptr<Rml::Releaser<Rml::Element>,void>
                ((unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>> *)this,(nullptr_t)0x0);
      return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
              ::operator->(&local_30);
    pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(this_00);
    if (pEVar3 == in_RDX) break;
    itr._M_current =
         (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
         ((long)&((itr._M_current)->_M_t).
                 super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                 super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl + 1);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
    ::operator++(&local_30);
  }
  local_44 = 0;
  for (pEStack_40 = in_RDX; iVar1._M_current = itr._M_current,
      local_44 < 3 && pEStack_40 != (pointer)0x0; pEStack_40 = GetParentNode(pEStack_40)) {
    (*(pEStack_40->super_ScriptInterface).super_Releasable._vptr_Releasable[0x14])
              (pEStack_40,in_RDX);
    local_44 = local_44 + 1;
  }
  sVar4 = ::std::
          vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
          ::size(&child->children);
  if ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
      (sVar4 - (long)child->num_non_dom_children) <= iVar1._M_current) {
    child->num_non_dom_children = child->num_non_dom_children + -1;
  }
  local_45 = 0;
  puVar5 = __gnu_cxx::
           __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
           ::operator*(&local_30);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr
            ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this,puVar5);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
  ::__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>*>
            ((__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
              *)&local_50,&local_30);
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::erase(&child->children,local_50);
  if (in_RDX == child->focus) {
    child->focus = (Element *)0x0;
    this_01 = GetContext(child);
    if (this_01 != (Context *)0x0) {
      for (local_78 = Context::GetFocusElement(this_01); local_78 != (Element *)0x0;
          local_78 = GetParentNode(local_78)) {
        if (local_78 == in_RDX) {
          Focus(child,false);
          break;
        }
      }
    }
  }
  pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                     ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
  SetParent(pEVar3,(Element *)0x0);
  (*(child->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])();
  DirtyStackingContext(child);
  DirtyDefinition(child,Self);
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Element::RemoveChild(Element* child)
{
	size_t child_index = 0;

	for (auto itr = children.begin(); itr != children.end(); ++itr)
	{
		// Add the element to the delete list
		if (itr->get() == child)
		{
			Element* ancestor = child;
			for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
				ancestor->OnChildRemove(child);

			if (child_index >= children.size() - num_non_dom_children)
				num_non_dom_children--;

			ElementPtr detached_child = std::move(*itr);
			children.erase(itr);

			// Remove the child element as the focused child of this element.
			if (child == focus)
			{
				focus = nullptr;

				// If this child (or a descendant of this child) is the context's currently
				// focused element, set the focus to us instead.
				if (Context* context = GetContext())
				{
					Element* focus_element = context->GetFocusElement();
					while (focus_element)
					{
						if (focus_element == child)
						{
							Focus();
							break;
						}

						focus_element = focus_element->GetParentNode();
					}
				}
			}

			detached_child->SetParent(nullptr);

			DirtyLayout();
			DirtyStackingContext();
			DirtyDefinition(DirtyNodes::Self);

			return detached_child;
		}

		child_index++;
	}

	return nullptr;
}